

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

vector3f tinyusdz::transform(matrix4d *m,vector3f *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  vector3f vVar4;
  vector3f vVar5;
  
  dVar1 = m->m[3][0];
  dVar2 = m->m[3][1];
  dVar3 = m->m[3][2];
  vVar4 = value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::vector3f,double,float,3ul>(m,p);
  vVar5.z = vVar4.z + (float)dVar3;
  vVar5.y = vVar4.y + (float)dVar2;
  vVar5.x = (float)dVar1 + vVar4.x;
  return vVar5;
}

Assistant:

value::vector3f transform(const value::matrix4d &m, const value::vector3f &p) {
  value::vector3f tx{float(m.m[3][0]), float(m.m[3][1]), float(m.m[3][2])};
  return value::MultV<value::matrix4d, value::vector3f, double, float, 3>(m, p) + tx;
}